

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::BinaryOp_x86_fma::forward
          (BinaryOp_x86_fma *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Mat *pMVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  Mat *m;
  float *pfVar12;
  int iVar13;
  undefined1 (*pauVar14) [32];
  Option *opt_00;
  undefined1 (*pauVar15) [32];
  int iVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  Mat *b;
  long lVar20;
  float *pfVar21;
  float fVar22;
  float fVar23;
  float fVar25;
  float fVar26;
  float fVar29;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined1 auVar24 [16];
  undefined8 uVar30;
  undefined8 uVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar40 [64];
  float in_register_000012dc;
  undefined1 auVar41 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  __m128 afVar44;
  binary_op_ratan2 op;
  __m128 _b;
  __m256 _b_avx;
  binary_op_ratan2 local_135;
  int local_134;
  long local_130;
  long local_128;
  Mat *local_120;
  Mat *local_118;
  float local_110 [2];
  float afStack_108 [2];
  float local_100 [2];
  float afStack_f8 [2];
  float afStack_f0 [2];
  float afStack_e8 [6];
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  float afStack_b0 [2];
  float afStack_a8 [2];
  undefined1 local_a0 [32];
  float local_80 [2];
  float afStack_78 [2];
  float afStack_70 [2];
  float afStack_68 [14];
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  b = pMVar4 + 1;
  iVar13 = pMVar4[1].h * pMVar4[1].w * pMVar4[1].d * pMVar4[1].c * pMVar4[1].elempack;
  if (((pMVar4->dims < pMVar4[1].dims) && (iVar13 != 1)) ||
     (pMVar4->c * pMVar4->elempack * pMVar4->d * pMVar4->h * pMVar4->w < iVar13)) {
    uVar11 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86_fma[-3]);
    switch(uVar11) {
    case 1:
      uVar11 = 7;
      break;
    case 3:
      uVar11 = 8;
      break;
    case 6:
      uVar11 = 9;
      break;
    case 7:
      uVar11 = 1;
      break;
    case 8:
      uVar11 = 3;
      break;
    case 9:
      uVar11 = 6;
      break;
    case 10:
      uVar11 = 0xb;
      break;
    case 0xb:
      uVar11 = 10;
    }
    m = b;
    b = pMVar4;
  }
  else {
    uVar11 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86_fma[-3]);
    m = pMVar4;
  }
  pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Mat::create_like(pMVar4,m,opt->blob_allocator);
  if (pMVar4->data == (void *)0x0) {
    return -100;
  }
  if ((long)pMVar4->c * pMVar4->cstep == 0) {
    return -100;
  }
  uVar19 = b->elempack;
  opt_00 = (Option *)(ulong)uVar19;
  uVar18 = b->w;
  iVar13 = b->h;
  iVar16 = b->d;
  iVar1 = b->c;
  if (iVar16 * iVar1 * iVar13 * uVar18 * uVar19 == 1) {
    if (0xb < uVar11) {
      return 0;
    }
    fVar23 = *b->data;
    local_d0 = ZEXT416((uint)fVar23);
    auVar24 = ZEXT416((uint)fVar23);
    auVar43 = ZEXT416((uint)fVar23);
    local_120 = pMVar4;
    local_118 = m;
    switch(uVar11) {
    case 1:
      iVar13 = m->c;
      if ((long)iVar13 < 1) {
        return 0;
      }
      uVar11 = m->h * m->w * m->d * m->elempack;
      auVar43 = vshufps_avx(auVar24,auVar43,0);
      auVar34._16_16_ = auVar43;
      auVar34._0_16_ = auVar43;
      lVar20 = 0;
      do {
        pauVar14 = (undefined1 (*) [32])(m->cstep * lVar20 * m->elemsize + (long)m->data);
        pauVar15 = (undefined1 (*) [32])
                   (pMVar4->cstep * lVar20 * pMVar4->elemsize + (long)pMVar4->data);
        if ((int)uVar11 < 8) {
          uVar19 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar36 = vsubps_avx(*pauVar14,auVar34);
            *pauVar15 = auVar36;
            pauVar14 = pauVar14 + 1;
            pauVar15 = pauVar15 + 1;
            iVar16 = iVar16 + 8;
            uVar19 = uVar11 & 0xfffffff8;
          } while (iVar16 < (int)uVar11);
        }
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar11) {
          auVar24 = vsubps_avx(*(undefined1 (*) [16])*pauVar14,auVar43);
          *(undefined1 (*) [16])*pauVar15 = auVar24;
          pauVar14 = (undefined1 (*) [32])(*pauVar14 + 0x10);
          pauVar15 = (undefined1 (*) [32])((long)*pauVar15 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if (uVar11 - uVar19 != 0 && (int)uVar19 <= (int)uVar11) {
          lVar17 = 0;
          do {
            *(float *)((long)*pauVar15 + lVar17 * 4) = *(float *)(*pauVar14 + lVar17 * 4) - fVar23;
            lVar17 = lVar17 + 1;
          } while (uVar11 - uVar19 != (int)lVar17);
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != iVar13);
      return 0;
    case 2:
      iVar13 = m->c;
      if ((long)iVar13 < 1) {
        return 0;
      }
      uVar11 = m->h * m->w * m->d * m->elempack;
      auVar43 = vshufps_avx(auVar24,auVar24,0);
      lVar20 = 0;
      do {
        pfVar12 = (float *)(m->cstep * lVar20 * m->elemsize + (long)m->data);
        pauVar14 = (undefined1 (*) [32])
                   (pMVar4->cstep * lVar20 * pMVar4->elemsize + (long)pMVar4->data);
        fVar22 = auVar43._0_4_;
        fVar25 = auVar43._4_4_;
        fVar26 = auVar43._8_4_;
        if ((int)uVar11 < 8) {
          uVar19 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar40._0_4_ = fVar22 * *pfVar12;
            auVar40._4_4_ = fVar25 * pfVar12[1];
            auVar40._8_4_ = fVar26 * pfVar12[2];
            auVar40._12_4_ = auVar43._12_4_ * pfVar12[3];
            auVar40._16_4_ = fVar22 * pfVar12[4];
            auVar40._20_4_ = fVar25 * pfVar12[5];
            auVar40._28_36_ = in_ZMM2._28_36_;
            auVar40._24_4_ = fVar26 * pfVar12[6];
            in_ZMM2 = ZEXT3264(auVar40._0_32_);
            *pauVar14 = auVar40._0_32_;
            pfVar12 = pfVar12 + 8;
            pauVar14 = pauVar14 + 1;
            iVar16 = iVar16 + 8;
            uVar19 = uVar11 & 0xfffffff8;
          } while (iVar16 < (int)uVar11);
        }
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar11) {
          auVar38._0_4_ = fVar22 * *pfVar12;
          auVar38._4_4_ = fVar25 * pfVar12[1];
          auVar38._8_4_ = fVar26 * pfVar12[2];
          auVar38._12_4_ = auVar43._12_4_ * pfVar12[3];
          in_ZMM2 = ZEXT1664(auVar38);
          *(undefined1 (*) [16])*pauVar14 = auVar38;
          pfVar12 = pfVar12 + 4;
          pauVar14 = (undefined1 (*) [32])((long)*pauVar14 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if (uVar11 - uVar19 != 0 && (int)uVar19 <= (int)uVar11) {
          lVar17 = 0;
          do {
            in_ZMM2 = ZEXT464((uint)(fVar23 * pfVar12[lVar17]));
            *(float *)((long)*pauVar14 + lVar17 * 4) = fVar23 * pfVar12[lVar17];
            lVar17 = lVar17 + 1;
          } while (uVar11 - uVar19 != (int)lVar17);
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != iVar13);
      return 0;
    case 3:
      iVar13 = m->c;
      if ((long)iVar13 < 1) {
        return 0;
      }
      uVar11 = m->h * m->w * m->d * m->elempack;
      auVar24._0_4_ = 1.0 / fVar23;
      auVar24._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar43 = vshufps_avx(auVar24,auVar24,0);
      lVar20 = 0;
      do {
        pfVar12 = (float *)(m->cstep * lVar20 * m->elemsize + (long)m->data);
        pfVar21 = (float *)(pMVar4->cstep * lVar20 * pMVar4->elemsize + (long)pMVar4->data);
        fVar23 = auVar43._0_4_;
        fVar22 = auVar43._4_4_;
        fVar25 = auVar43._8_4_;
        if ((int)uVar11 < 8) {
          uVar19 = 0;
        }
        else {
          iVar16 = 7;
          do {
            fVar26 = pfVar12[1];
            fVar29 = pfVar12[2];
            fVar5 = pfVar12[3];
            fVar6 = pfVar12[4];
            fVar7 = pfVar12[5];
            fVar8 = pfVar12[6];
            *pfVar21 = fVar23 * *pfVar12;
            pfVar21[1] = fVar22 * fVar26;
            pfVar21[2] = fVar25 * fVar29;
            pfVar21[3] = auVar43._12_4_ * fVar5;
            pfVar21[4] = fVar23 * fVar6;
            pfVar21[5] = fVar22 * fVar7;
            pfVar21[6] = fVar25 * fVar8;
            pfVar21[7] = in_register_000012dc;
            pfVar12 = pfVar12 + 8;
            pfVar21 = pfVar21 + 8;
            iVar16 = iVar16 + 8;
            uVar19 = uVar11 & 0xfffffff8;
          } while (iVar16 < (int)uVar11);
        }
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar11) {
          fVar26 = pfVar12[1];
          fVar29 = pfVar12[2];
          fVar5 = pfVar12[3];
          in_register_000012dc = 0.0;
          *pfVar21 = fVar23 * *pfVar12;
          pfVar21[1] = fVar22 * fVar26;
          pfVar21[2] = fVar25 * fVar29;
          pfVar21[3] = auVar43._12_4_ * fVar5;
          pfVar12 = pfVar12 + 4;
          pfVar21 = pfVar21 + 4;
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if (uVar11 - uVar19 != 0 && (int)uVar19 <= (int)uVar11) {
          lVar17 = 0;
          do {
            in_register_000012dc = 0.0;
            pfVar21[lVar17] = auVar24._0_4_ * pfVar12[lVar17];
            lVar17 = lVar17 + 1;
          } while (uVar11 - uVar19 != (int)lVar17);
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != iVar13);
      return 0;
    case 4:
      iVar13 = m->c;
      if ((long)iVar13 < 1) {
        return 0;
      }
      uVar11 = m->h * m->w * m->d * m->elempack;
      auVar43 = vshufps_avx(auVar43,auVar43,0);
      auVar32._16_16_ = auVar43;
      auVar32._0_16_ = auVar43;
      lVar20 = 0;
      do {
        pauVar14 = (undefined1 (*) [32])(m->cstep * lVar20 * m->elemsize + (long)m->data);
        pauVar15 = (undefined1 (*) [32])
                   (pMVar4->cstep * lVar20 * pMVar4->elemsize + (long)pMVar4->data);
        if ((int)uVar11 < 8) {
          uVar19 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar36 = vmaxps_avx(auVar32,*pauVar14);
            *pauVar15 = auVar36;
            pauVar14 = pauVar14 + 1;
            pauVar15 = pauVar15 + 1;
            iVar16 = iVar16 + 8;
            uVar19 = uVar11 & 0xfffffff8;
          } while (iVar16 < (int)uVar11);
        }
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar11) {
          auVar38 = vmaxps_avx(auVar43,*(undefined1 (*) [16])*pauVar14);
          *(undefined1 (*) [16])*pauVar15 = auVar38;
          pauVar14 = (undefined1 (*) [32])(*pauVar14 + 0x10);
          pauVar15 = (undefined1 (*) [32])((long)*pauVar15 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if (uVar11 - uVar19 != 0 && (int)uVar19 <= (int)uVar11) {
          lVar17 = 0;
          do {
            auVar38 = vmaxss_avx(auVar24,ZEXT416(*(uint *)(*pauVar14 + lVar17 * 4)));
            *(int *)((long)*pauVar15 + lVar17 * 4) = auVar38._0_4_;
            lVar17 = lVar17 + 1;
          } while (uVar11 - uVar19 != (int)lVar17);
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != iVar13);
      return 0;
    case 5:
      iVar13 = m->c;
      if ((long)iVar13 < 1) {
        return 0;
      }
      uVar11 = m->h * m->w * m->d * m->elempack;
      auVar24 = vshufps_avx(auVar24,auVar43,0);
      auVar35._16_16_ = auVar24;
      auVar35._0_16_ = auVar24;
      lVar20 = 0;
      do {
        pauVar14 = (undefined1 (*) [32])(m->cstep * lVar20 * m->elemsize + (long)m->data);
        pauVar15 = (undefined1 (*) [32])
                   (pMVar4->cstep * lVar20 * pMVar4->elemsize + (long)pMVar4->data);
        if ((int)uVar11 < 8) {
          uVar19 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar36 = vminps_avx(auVar35,*pauVar14);
            *pauVar15 = auVar36;
            pauVar14 = pauVar14 + 1;
            pauVar15 = pauVar15 + 1;
            iVar16 = iVar16 + 8;
            uVar19 = uVar11 & 0xfffffff8;
          } while (iVar16 < (int)uVar11);
        }
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar11) {
          auVar38 = vminps_avx(auVar24,*(undefined1 (*) [16])*pauVar14);
          *(undefined1 (*) [16])*pauVar15 = auVar38;
          pauVar14 = (undefined1 (*) [32])(*pauVar14 + 0x10);
          pauVar15 = (undefined1 (*) [32])((long)*pauVar15 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if (uVar11 - uVar19 != 0 && (int)uVar19 <= (int)uVar11) {
          lVar17 = 0;
          do {
            auVar38 = vminss_avx(auVar43,ZEXT416(*(uint *)(*pauVar14 + lVar17 * 4)));
            *(int *)((long)*pauVar15 + lVar17 * 4) = auVar38._0_4_;
            lVar17 = lVar17 + 1;
          } while (uVar11 - uVar19 != (int)lVar17);
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != iVar13);
      return 0;
    case 6:
      local_130 = (long)m->c;
      if (local_130 < 1) {
        return 0;
      }
      local_134 = m->h * m->w * m->d * m->elempack;
      auVar43 = vshufps_avx(auVar24,auVar24,0);
      local_a0 = ZEXT1632(auVar43);
      register0x00001210 = auVar43;
      local_c0 = auVar43;
      local_128 = 0;
      do {
        auVar36 = _local_c0;
        pfVar21 = (float *)(local_118->cstep * local_128 * local_118->elemsize +
                           (long)local_118->data);
        pfVar12 = (float *)(local_120->cstep * local_128 * local_120->elemsize +
                           (long)local_120->data);
        local_80[0] = (float)local_c0._0_4_;
        local_80[1] = (float)local_c0._4_4_;
        afStack_78[0] = (float)local_c0._8_4_;
        afStack_78[1] = (float)local_c0._12_4_;
        afStack_70[0] = afStack_b0[0];
        afStack_70[1] = afStack_b0[1];
        afStack_68[0] = afStack_a8[0];
        afStack_68[1] = afStack_a8[1];
        _local_c0 = auVar36;
        if (local_134 < 8) {
          uVar11 = 0;
        }
        else {
          uVar19 = 0;
          do {
            uVar28 = *(undefined8 *)pfVar21;
            uVar27 = *(undefined8 *)(pfVar21 + 2);
            uVar30 = *(undefined8 *)(pfVar21 + 4);
            uVar31 = *(undefined8 *)(pfVar21 + 6);
            local_100 = (float  [2])uVar28;
            afStack_f8 = (float  [2])uVar27;
            afStack_f0 = (float  [2])uVar30;
            afStack_e8._0_8_ = uVar31;
            BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                      ((binary_op_pow *)&local_135,(__m256 *)local_100,(__m256 *)local_80);
            *(undefined8 *)pfVar12 = uVar28;
            *(undefined8 *)(pfVar12 + 2) = uVar27;
            *(undefined8 *)(pfVar12 + 4) = uVar30;
            *(undefined8 *)(pfVar12 + 6) = uVar31;
            pfVar21 = pfVar21 + 8;
            pfVar12 = pfVar12 + 8;
            uVar11 = uVar19 + 8;
            iVar13 = uVar19 + 0xf;
            uVar19 = uVar11;
          } while (iVar13 < local_134);
        }
        auVar36 = local_a0;
        local_100[0] = (float)local_a0._0_4_;
        local_100[1] = (float)local_a0._4_4_;
        afStack_f8[0] = (float)local_a0._8_4_;
        afStack_f8[1] = (float)local_a0._12_4_;
        local_a0 = auVar36;
        uVar19 = uVar11;
        if ((int)(uVar11 | 3) < local_134) {
          do {
            local_110 = *(float (*) [2])pfVar21;
            uVar28 = *(undefined8 *)(pfVar21 + 2);
            afStack_108 = (float  [2])uVar28;
            afVar44 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                ((binary_op_pow *)&local_135,(__m128 *)local_110,(__m128 *)local_100
                                );
            *(long *)pfVar12 = afVar44._0_8_;
            *(undefined8 *)(pfVar12 + 2) = uVar28;
            pfVar21 = pfVar21 + 4;
            pfVar12 = pfVar12 + 4;
            uVar11 = uVar19 + 4;
            iVar13 = uVar19 + 7;
            uVar19 = uVar11;
          } while (iVar13 < local_134);
        }
        iVar13 = local_134 - uVar11;
        if ((int)uVar11 < local_134) {
          lVar20 = 0;
          do {
            fVar23 = powf(pfVar21[lVar20],local_d0._0_4_);
            pfVar12[lVar20] = fVar23;
            lVar20 = lVar20 + 1;
          } while (iVar13 != (int)lVar20);
        }
        local_128 = local_128 + 1;
      } while (local_128 != local_130);
      return 0;
    case 7:
      iVar13 = m->c;
      if ((long)iVar13 < 1) {
        return 0;
      }
      uVar11 = m->h * m->w * m->d * m->elempack;
      auVar43 = vshufps_avx(auVar24,auVar24,0);
      auVar33._16_16_ = auVar43;
      auVar33._0_16_ = auVar43;
      lVar20 = 0;
      do {
        pauVar14 = (undefined1 (*) [32])(m->cstep * lVar20 * m->elemsize + (long)m->data);
        pauVar15 = (undefined1 (*) [32])
                   (pMVar4->cstep * lVar20 * pMVar4->elemsize + (long)pMVar4->data);
        if ((int)uVar11 < 8) {
          uVar19 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar36 = vsubps_avx(auVar33,*pauVar14);
            *pauVar15 = auVar36;
            pauVar14 = pauVar14 + 1;
            pauVar15 = pauVar15 + 1;
            iVar16 = iVar16 + 8;
            uVar19 = uVar11 & 0xfffffff8;
          } while (iVar16 < (int)uVar11);
        }
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar11) {
          auVar24 = vsubps_avx(auVar43,*(undefined1 (*) [16])*pauVar14);
          *(undefined1 (*) [16])*pauVar15 = auVar24;
          pauVar14 = (undefined1 (*) [32])(*pauVar14 + 0x10);
          pauVar15 = (undefined1 (*) [32])((long)*pauVar15 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if (uVar11 - uVar19 != 0 && (int)uVar19 <= (int)uVar11) {
          lVar17 = 0;
          do {
            *(float *)((long)*pauVar15 + lVar17 * 4) = fVar23 - *(float *)(*pauVar14 + lVar17 * 4);
            lVar17 = lVar17 + 1;
          } while (uVar11 - uVar19 != (int)lVar17);
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != iVar13);
      return 0;
    case 8:
      iVar13 = m->c;
      if ((long)iVar13 < 1) {
        return 0;
      }
      uVar11 = m->h * m->w * m->d * m->elempack;
      auVar43 = vshufps_avx(auVar24,auVar24,0);
      auVar36._16_16_ = auVar43;
      auVar36._0_16_ = auVar43;
      lVar20 = 0;
      do {
        pauVar14 = (undefined1 (*) [32])(m->cstep * lVar20 * m->elemsize + (long)m->data);
        pauVar15 = (undefined1 (*) [32])
                   (pMVar4->cstep * lVar20 * pMVar4->elemsize + (long)pMVar4->data);
        fVar22 = auVar43._0_4_;
        fVar25 = auVar43._4_4_;
        fVar26 = auVar43._8_4_;
        if ((int)uVar11 < 8) {
          uVar19 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar33 = vrcpps_avx(*pauVar14);
            auVar42._0_4_ = fVar22 * auVar33._0_4_;
            auVar42._4_4_ = fVar25 * auVar33._4_4_;
            auVar42._8_4_ = fVar26 * auVar33._8_4_;
            auVar42._12_4_ = auVar43._12_4_ * auVar33._12_4_;
            auVar42._16_4_ = fVar22 * auVar33._16_4_;
            auVar42._20_4_ = fVar25 * auVar33._20_4_;
            auVar42._28_36_ = in_ZMM4._28_36_;
            auVar42._24_4_ = fVar26 * auVar33._24_4_;
            auVar35 = auVar42._0_32_;
            in_ZMM4 = ZEXT3264(auVar35);
            auVar24 = vfmsub213ps_fma(*pauVar14,auVar35,auVar36);
            auVar24 = vfnmadd213ps_fma(ZEXT1632(auVar24),auVar33,auVar35);
            *pauVar15 = ZEXT1632(auVar24);
            pauVar14 = pauVar14 + 1;
            pauVar15 = pauVar15 + 1;
            iVar16 = iVar16 + 8;
            uVar19 = uVar11 & 0xfffffff8;
          } while (iVar16 < (int)uVar11);
        }
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar11) {
          auVar24 = vrcpps_avx(*(undefined1 (*) [16])*pauVar14);
          auVar41._0_4_ = fVar22 * auVar24._0_4_;
          auVar41._4_4_ = fVar25 * auVar24._4_4_;
          auVar41._8_4_ = fVar26 * auVar24._8_4_;
          auVar41._12_4_ = auVar43._12_4_ * auVar24._12_4_;
          in_ZMM4 = ZEXT1664(auVar41);
          auVar38 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar14,auVar41,auVar43);
          auVar24 = vfnmadd213ps_fma(auVar38,auVar24,auVar41);
          *(undefined1 (*) [16])*pauVar15 = auVar24;
          pauVar14 = (undefined1 (*) [32])(*pauVar14 + 0x10);
          pauVar15 = (undefined1 (*) [32])((long)*pauVar15 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if (uVar11 - uVar19 != 0 && (int)uVar19 <= (int)uVar11) {
          lVar17 = 0;
          do {
            *(float *)((long)*pauVar15 + lVar17 * 4) = fVar23 / *(float *)(*pauVar14 + lVar17 * 4);
            lVar17 = lVar17 + 1;
          } while (uVar11 - uVar19 != (int)lVar17);
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != iVar13);
      return 0;
    case 9:
      local_130 = (long)m->c;
      if (local_130 < 1) {
        return 0;
      }
      local_134 = m->h * m->w * m->d * m->elempack;
      auVar43 = vshufps_avx(auVar24,auVar24,0);
      local_a0 = ZEXT1632(auVar43);
      register0x00001210 = auVar43;
      local_c0 = auVar43;
      local_128 = 0;
      do {
        auVar36 = _local_c0;
        pfVar21 = (float *)(local_118->cstep * local_128 * local_118->elemsize +
                           (long)local_118->data);
        pfVar12 = (float *)(local_120->cstep * local_128 * local_120->elemsize +
                           (long)local_120->data);
        local_80[0] = (float)local_c0._0_4_;
        local_80[1] = (float)local_c0._4_4_;
        afStack_78[0] = (float)local_c0._8_4_;
        afStack_78[1] = (float)local_c0._12_4_;
        afStack_70[0] = afStack_b0[0];
        afStack_70[1] = afStack_b0[1];
        afStack_68[0] = afStack_a8[0];
        afStack_68[1] = afStack_a8[1];
        _local_c0 = auVar36;
        if (local_134 < 8) {
          uVar11 = 0;
        }
        else {
          uVar19 = 0;
          do {
            uVar28 = *(undefined8 *)pfVar21;
            uVar27 = *(undefined8 *)(pfVar21 + 2);
            uVar30 = *(undefined8 *)(pfVar21 + 4);
            uVar31 = *(undefined8 *)(pfVar21 + 6);
            local_100 = (float  [2])uVar28;
            afStack_f8 = (float  [2])uVar27;
            afStack_f0 = (float  [2])uVar30;
            afStack_e8._0_8_ = uVar31;
            BinaryOp_x86_fma_functor::binary_op_rpow::func_pack8
                      ((binary_op_rpow *)&local_135,(__m256 *)local_100,(__m256 *)local_80);
            *(undefined8 *)pfVar12 = uVar28;
            *(undefined8 *)(pfVar12 + 2) = uVar27;
            *(undefined8 *)(pfVar12 + 4) = uVar30;
            *(undefined8 *)(pfVar12 + 6) = uVar31;
            pfVar21 = pfVar21 + 8;
            pfVar12 = pfVar12 + 8;
            uVar11 = uVar19 + 8;
            iVar13 = uVar19 + 0xf;
            uVar19 = uVar11;
          } while (iVar13 < local_134);
        }
        auVar36 = local_a0;
        local_100[0] = (float)local_a0._0_4_;
        local_100[1] = (float)local_a0._4_4_;
        afStack_f8[0] = (float)local_a0._8_4_;
        afStack_f8[1] = (float)local_a0._12_4_;
        local_a0 = auVar36;
        uVar19 = uVar11;
        if ((int)(uVar11 | 3) < local_134) {
          do {
            local_110 = *(float (*) [2])pfVar21;
            uVar28 = *(undefined8 *)(pfVar21 + 2);
            afStack_108 = (float  [2])uVar28;
            afVar44 = BinaryOp_x86_fma_functor::binary_op_rpow::func_pack4
                                ((binary_op_rpow *)&local_135,(__m128 *)local_110,
                                 (__m128 *)local_100);
            *(long *)pfVar12 = afVar44._0_8_;
            *(undefined8 *)(pfVar12 + 2) = uVar28;
            pfVar21 = pfVar21 + 4;
            pfVar12 = pfVar12 + 4;
            uVar11 = uVar19 + 4;
            iVar13 = uVar19 + 7;
            uVar19 = uVar11;
          } while (iVar13 < local_134);
        }
        iVar13 = local_134 - uVar11;
        if ((int)uVar11 < local_134) {
          lVar20 = 0;
          do {
            fVar23 = powf((float)local_d0._0_4_,pfVar21[lVar20]);
            pfVar12[lVar20] = fVar23;
            lVar20 = lVar20 + 1;
          } while (iVar13 != (int)lVar20);
        }
        local_128 = local_128 + 1;
      } while (local_128 != local_130);
      return 0;
    case 10:
      local_130 = (long)m->c;
      if (local_130 < 1) {
        return 0;
      }
      local_134 = m->h * m->w * m->d * m->elempack;
      auVar43 = vshufps_avx(auVar24,auVar24,0);
      local_a0 = ZEXT1632(auVar43);
      register0x00001210 = auVar43;
      local_c0 = auVar43;
      local_128 = 0;
      do {
        auVar36 = _local_c0;
        pfVar21 = (float *)(local_118->cstep * local_128 * local_118->elemsize +
                           (long)local_118->data);
        pfVar12 = (float *)(local_120->cstep * local_128 * local_120->elemsize +
                           (long)local_120->data);
        local_80[0] = (float)local_c0._0_4_;
        local_80[1] = (float)local_c0._4_4_;
        afStack_78[0] = (float)local_c0._8_4_;
        afStack_78[1] = (float)local_c0._12_4_;
        afStack_70[0] = afStack_b0[0];
        afStack_70[1] = afStack_b0[1];
        afStack_68[0] = afStack_a8[0];
        afStack_68[1] = afStack_a8[1];
        _local_c0 = auVar36;
        if (local_134 < 8) {
          uVar11 = 0;
        }
        else {
          uVar19 = 0;
          do {
            uVar28 = *(undefined8 *)pfVar21;
            uVar27 = *(undefined8 *)(pfVar21 + 2);
            uVar30 = *(undefined8 *)(pfVar21 + 4);
            uVar31 = *(undefined8 *)(pfVar21 + 6);
            local_100 = (float  [2])uVar28;
            afStack_f8 = (float  [2])uVar27;
            afStack_f0 = (float  [2])uVar30;
            afStack_e8._0_8_ = uVar31;
            BinaryOp_x86_fma_functor::binary_op_atan2::func_pack8
                      ((binary_op_atan2 *)&local_135,(__m256 *)local_100,(__m256 *)local_80);
            *(undefined8 *)pfVar12 = uVar28;
            *(undefined8 *)(pfVar12 + 2) = uVar27;
            *(undefined8 *)(pfVar12 + 4) = uVar30;
            *(undefined8 *)(pfVar12 + 6) = uVar31;
            pfVar21 = pfVar21 + 8;
            pfVar12 = pfVar12 + 8;
            uVar11 = uVar19 + 8;
            iVar13 = uVar19 + 0xf;
            uVar19 = uVar11;
          } while (iVar13 < local_134);
        }
        auVar36 = local_a0;
        local_100[0] = (float)local_a0._0_4_;
        local_100[1] = (float)local_a0._4_4_;
        afStack_f8[0] = (float)local_a0._8_4_;
        afStack_f8[1] = (float)local_a0._12_4_;
        local_a0 = auVar36;
        uVar19 = uVar11;
        if ((int)(uVar11 | 3) < local_134) {
          do {
            local_110 = *(float (*) [2])pfVar21;
            uVar28 = *(undefined8 *)(pfVar21 + 2);
            afStack_108 = (float  [2])uVar28;
            afVar44 = BinaryOp_x86_fma_functor::binary_op_atan2::func_pack4
                                ((binary_op_atan2 *)&local_135,(__m128 *)local_110,
                                 (__m128 *)local_100);
            *(long *)pfVar12 = afVar44._0_8_;
            *(undefined8 *)(pfVar12 + 2) = uVar28;
            pfVar21 = pfVar21 + 4;
            pfVar12 = pfVar12 + 4;
            uVar11 = uVar19 + 4;
            iVar13 = uVar19 + 7;
            uVar19 = uVar11;
          } while (iVar13 < local_134);
        }
        iVar13 = local_134 - uVar11;
        if ((int)uVar11 < local_134) {
          lVar20 = 0;
          do {
            fVar23 = atan2f(pfVar21[lVar20],local_d0._0_4_);
            pfVar12[lVar20] = fVar23;
            lVar20 = lVar20 + 1;
          } while (iVar13 != (int)lVar20);
        }
        local_128 = local_128 + 1;
      } while (local_128 != local_130);
      return 0;
    case 0xb:
      local_130 = (long)m->c;
      if (local_130 < 1) {
        return 0;
      }
      local_134 = m->h * m->w * m->d * m->elempack;
      auVar43 = vshufps_avx(local_d0,auVar24,0);
      local_a0 = ZEXT1632(auVar43);
      register0x00001210 = auVar43;
      local_c0 = auVar43;
      local_128 = 0;
      do {
        auVar36 = _local_c0;
        pfVar21 = (float *)(local_118->cstep * local_128 * local_118->elemsize +
                           (long)local_118->data);
        pfVar12 = (float *)(local_120->cstep * local_128 * local_120->elemsize +
                           (long)local_120->data);
        local_80[0] = (float)local_c0._0_4_;
        local_80[1] = (float)local_c0._4_4_;
        afStack_78[0] = (float)local_c0._8_4_;
        afStack_78[1] = (float)local_c0._12_4_;
        afStack_70[0] = afStack_b0[0];
        afStack_70[1] = afStack_b0[1];
        afStack_68[0] = afStack_a8[0];
        afStack_68[1] = afStack_a8[1];
        _local_c0 = auVar36;
        if (local_134 < 8) {
          uVar11 = 0;
        }
        else {
          uVar19 = 0;
          do {
            uVar28 = *(undefined8 *)pfVar21;
            uVar27 = *(undefined8 *)(pfVar21 + 2);
            uVar30 = *(undefined8 *)(pfVar21 + 4);
            uVar31 = *(undefined8 *)(pfVar21 + 6);
            local_100 = (float  [2])uVar28;
            afStack_f8 = (float  [2])uVar27;
            afStack_f0 = (float  [2])uVar30;
            afStack_e8._0_8_ = uVar31;
            BinaryOp_x86_fma_functor::binary_op_ratan2::func_pack8
                      (&local_135,(__m256 *)local_100,(__m256 *)local_80);
            *(undefined8 *)pfVar12 = uVar28;
            *(undefined8 *)(pfVar12 + 2) = uVar27;
            *(undefined8 *)(pfVar12 + 4) = uVar30;
            *(undefined8 *)(pfVar12 + 6) = uVar31;
            pfVar21 = pfVar21 + 8;
            pfVar12 = pfVar12 + 8;
            uVar11 = uVar19 + 8;
            iVar13 = uVar19 + 0xf;
            uVar19 = uVar11;
          } while (iVar13 < local_134);
        }
        auVar36 = local_a0;
        local_100[0] = (float)local_a0._0_4_;
        local_100[1] = (float)local_a0._4_4_;
        afStack_f8[0] = (float)local_a0._8_4_;
        afStack_f8[1] = (float)local_a0._12_4_;
        local_a0 = auVar36;
        uVar19 = uVar11;
        if ((int)(uVar11 | 3) < local_134) {
          do {
            local_110 = *(float (*) [2])pfVar21;
            uVar28 = *(undefined8 *)(pfVar21 + 2);
            afStack_108 = (float  [2])uVar28;
            afVar44 = BinaryOp_x86_fma_functor::binary_op_ratan2::func_pack4
                                (&local_135,(__m128 *)local_110,(__m128 *)local_100);
            *(long *)pfVar12 = afVar44._0_8_;
            *(undefined8 *)(pfVar12 + 2) = uVar28;
            pfVar21 = pfVar21 + 4;
            pfVar12 = pfVar12 + 4;
            uVar11 = uVar19 + 4;
            iVar13 = uVar19 + 7;
            uVar19 = uVar11;
          } while (iVar13 < local_134);
        }
        iVar13 = local_134 - uVar11;
        if ((int)uVar11 < local_134) {
          lVar20 = 0;
          do {
            fVar23 = atan2f((float)local_d0._0_4_,pfVar21[lVar20]);
            pfVar12[lVar20] = fVar23;
            lVar20 = lVar20 + 1;
          } while (iVar13 != (int)lVar20);
        }
        local_128 = local_128 + 1;
      } while (local_128 != local_130);
      return 0;
    }
    iVar13 = m->c;
    if ((long)iVar13 < 1) {
      return 0;
    }
    uVar11 = m->h * m->w * m->d * m->elempack;
    auVar43 = vshufps_avx(auVar43,auVar24,0);
    lVar20 = 0;
    do {
      pfVar12 = (float *)(m->cstep * lVar20 * m->elemsize + (long)m->data);
      pauVar14 = (undefined1 (*) [32])
                 (pMVar4->cstep * lVar20 * pMVar4->elemsize + (long)pMVar4->data);
      fVar22 = auVar43._0_4_;
      fVar25 = auVar43._4_4_;
      fVar26 = auVar43._8_4_;
      fVar29 = auVar43._12_4_;
      if ((int)uVar11 < 8) {
        uVar19 = 0;
      }
      else {
        iVar16 = 7;
        do {
          auVar39._0_4_ = fVar22 + *pfVar12;
          auVar39._4_4_ = fVar25 + pfVar12[1];
          auVar39._8_4_ = fVar26 + pfVar12[2];
          auVar39._12_4_ = fVar29 + pfVar12[3];
          auVar39._16_4_ = fVar22 + pfVar12[4];
          auVar39._20_4_ = fVar25 + pfVar12[5];
          auVar39._24_4_ = fVar26 + pfVar12[6];
          auVar39._28_4_ = fVar29 + pfVar12[7];
          *pauVar14 = auVar39;
          pfVar12 = pfVar12 + 8;
          pauVar14 = pauVar14 + 1;
          iVar16 = iVar16 + 8;
          uVar19 = uVar11 & 0xfffffff8;
        } while (iVar16 < (int)uVar11);
      }
      uVar18 = uVar19 | 3;
      while ((int)uVar18 < (int)uVar11) {
        auVar37._0_4_ = fVar22 + *pfVar12;
        auVar37._4_4_ = fVar25 + pfVar12[1];
        auVar37._8_4_ = fVar26 + pfVar12[2];
        auVar37._12_4_ = fVar29 + pfVar12[3];
        *(undefined1 (*) [16])*pauVar14 = auVar37;
        pfVar12 = pfVar12 + 4;
        pauVar14 = (undefined1 (*) [32])((long)*pauVar14 + 0x10);
        uVar18 = uVar19 + 7;
        uVar19 = uVar19 + 4;
      }
      if (uVar11 - uVar19 != 0 && (int)uVar19 <= (int)uVar11) {
        lVar17 = 0;
        do {
          *(float *)((long)*pauVar14 + lVar17 * 4) = fVar23 + pfVar12[lVar17];
          lVar17 = lVar17 + 1;
        } while (uVar11 - uVar19 != (int)lVar17);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != iVar13);
    return 0;
  }
  iVar2 = m->dims;
  iVar3 = b->dims;
  if ((((iVar2 == iVar3) && (m->w == uVar18)) &&
      ((m->h == iVar13 && ((m->d == iVar16 && (m->c == iVar1)))))) && (m->elempack == uVar19)) {
    binary_op_no_broadcast(m,b,pMVar4,uVar11,opt_00);
    return 0;
  }
  if (iVar3 < iVar2) {
LAB_0039ada3:
    binary_op_broadcast_inner(m,b,pMVar4,uVar11,opt_00);
    return 0;
  }
  if (iVar2 == 2) {
    if ((uVar18 == 1) && (iVar13 == m->h)) goto LAB_0039ada3;
LAB_0039ae0f:
    bVar10 = false;
LAB_0039ae12:
    bVar9 = false;
  }
  else {
    if (iVar2 == 4) {
      bVar10 = true;
      if ((uVar18 == 1) &&
         (((iVar13 == 1 &&
           (((iVar16 == 1 && (iVar1 == m->c)) || ((iVar16 == m->d && (iVar1 == m->c)))))) ||
          (((iVar13 == m->h && (iVar16 == m->d)) && (iVar1 == m->c)))))) goto LAB_0039ada3;
      goto LAB_0039ae12;
    }
    if (iVar2 != 3) goto LAB_0039ae0f;
    bVar9 = true;
    if ((uVar18 == 1) &&
       (((iVar13 == 1 && (iVar1 == m->c)) || ((iVar13 == m->h && (iVar1 == m->c))))))
    goto LAB_0039ada3;
    bVar10 = false;
  }
  if (uVar19 == 1) {
    if (((iVar2 == 2) && (iVar13 == 1)) && (uVar18 == m->w)) {
LAB_0039ae87:
      binary_op_broadcast_outer(m,b,pMVar4,uVar11,opt_00);
      return 0;
    }
    if (bVar9) {
      uVar19 = m->w;
      opt_00 = (Option *)(ulong)uVar19;
      if ((((iVar1 == 1) && (iVar13 == 1)) && (uVar18 == uVar19)) ||
         (((uVar18 == uVar19 && (iVar1 == 1)) && (iVar13 == m->h)))) goto LAB_0039ae87;
    }
    if (bVar10) {
      uVar19 = m->w;
      opt_00 = (Option *)(ulong)uVar19;
      if (((((iVar1 == 1) && (iVar16 == 1)) && (iVar13 == 1)) && (uVar18 == uVar19)) ||
         ((uVar18 == uVar19 &&
          ((((iVar1 == 1 && (iVar16 == 1)) && (iVar13 == m->h)) ||
           (((iVar13 == m->h && (iVar1 == 1)) && (iVar16 == m->d)))))))) goto LAB_0039ae87;
    }
  }
  if (!bVar9 || iVar3 != 3) {
    return 0;
  }
  if (iVar13 != 1) {
    return 0;
  }
  if (m->w != uVar18) {
    return 0;
  }
  if (m->c != iVar1) {
    return 0;
  }
  binary_op_broadcast_20(m,b,pMVar4,uVar11,opt_00);
  return 0;
}

Assistant:

int BinaryOp_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const bool b_is_scalar = bottom_blobs[1].w * bottom_blobs[1].h * bottom_blobs[1].d * bottom_blobs[1].c * bottom_blobs[1].elempack == 1;
    const bool a_rank_is_lower = bottom_blobs[0].dims < bottom_blobs[1].dims && !b_is_scalar;
    const bool a_size_is_lower = bottom_blobs[0].w * bottom_blobs[0].h * bottom_blobs[0].d * bottom_blobs[0].c * bottom_blobs[0].elempack < bottom_blobs[1].w * bottom_blobs[1].h * bottom_blobs[1].d * bottom_blobs[1].c * bottom_blobs[1].elempack;
    const bool a_is_lower = a_rank_is_lower || (!a_rank_is_lower && a_size_is_lower);
    const Mat& A = a_is_lower ? bottom_blobs[1] : bottom_blobs[0];
    const Mat& B = a_is_lower ? bottom_blobs[0] : bottom_blobs[1];
    const int op_type_r = a_is_lower ? get_reverse_op_type(op_type) : op_type;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(A, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // B is a scalar
    if (B.w * B.h * B.d * B.c * B.elempack == 1)
    {
        return binary_op_scalar(A, B[0], top_blob, op_type_r, opt);
    }

    // no broadcast
    if (A.dims == B.dims && A.w == B.w && A.h == B.h && A.d == B.d && A.c == B.c && A.elempack == B.elempack)
    {
        return binary_op_no_broadcast(A, B, top_blob, op_type_r, opt);
    }

    // broadcast B for inner axis
    if ((B.dims < A.dims)
            || (A.dims == 2 && B.w == 1 && B.h == A.h)
            || (A.dims == 3 && B.w == 1 && B.h == 1 && B.c == A.c)
            || (A.dims == 3 && B.w == 1 && B.h == A.h && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == 1 && B.d == 1 && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == 1 && B.d == A.d && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == A.h && B.d == A.d && B.c == A.c))
    {
        return binary_op_broadcast_inner(A, B, top_blob, op_type_r, opt);
    }

    // broadcast B for outer axis
    if (B.elempack == 1 && ((A.dims == 2 && B.w == A.w && B.h == 1) || (A.dims == 3 && B.w == A.w && B.h == 1 && B.c == 1) || (A.dims == 3 && B.w == A.w && B.h == A.h && B.c == 1) || (A.dims == 4 && B.w == A.w && B.h == 1 && B.d == 1 && B.c == 1) || (A.dims == 4 && B.w == A.w && B.h == A.h && B.d == 1 && B.c == 1) || (A.dims == 4 && B.w == A.w && B.h == A.h && B.d == A.d && B.c == 1)))
    {
        return binary_op_broadcast_outer(A, B, top_blob, op_type_r, opt);
    }

    // some special broadcast rule here
    if (A.dims == 3 && B.dims == 3 && A.w == B.w && B.h == 1 && A.c == B.c)
    {
        return binary_op_broadcast_20(A, B, top_blob, op_type_r, opt);
    }

    return 0;
}